

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_replace_whole(REF_CELL ref_cell,REF_INT cell,REF_INT *nodes)

{
  REF_INT node;
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  uVar2 = 1;
  if (((-1 < cell) && (cell < ref_cell->max)) &&
     (lVar5 = (long)cell, ref_cell->c2n[ref_cell->size_per * lVar5] != -1)) {
    lVar6 = 0;
    do {
      if (ref_cell->node_per <= lVar6) {
        if (ref_cell->last_node_is_an_id == 0) {
          return 0;
        }
        iVar1 = ref_cell->size_per;
        ref_cell->c2n[cell * iVar1 + iVar1 + -1] = nodes[(long)iVar1 + -1];
        return 0;
      }
      uVar2 = ref_adj_remove(ref_cell->ref_adj,ref_cell->c2n[ref_cell->size_per * lVar5 + lVar6],
                             cell);
      if (uVar2 != 0) {
        pcVar4 = "unregister cell";
        uVar3 = 0x326;
        goto LAB_00111ba3;
      }
      node = nodes[lVar6];
      ref_cell->c2n[ref_cell->size_per * lVar5 + lVar6] = node;
      uVar2 = ref_adj_add(ref_cell->ref_adj,node,cell);
      lVar6 = lVar6 + 1;
    } while (uVar2 == 0);
    pcVar4 = "register cell with id";
    uVar3 = 0x329;
LAB_00111ba3:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar3,
           "ref_cell_replace_whole",(ulong)uVar2,pcVar4);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_replace_whole(REF_CELL ref_cell, REF_INT cell,
                                          REF_INT *nodes) {
  REF_INT node;
  if (!ref_cell_valid(ref_cell, cell)) return REF_FAILURE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
    RSS(ref_adj_remove(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                       cell),
        "unregister cell");
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];
    RSS(ref_adj_add(ref_cell->ref_adj, nodes[node], cell),
        "register cell with id");
  }

  if (ref_cell_last_node_is_an_id(ref_cell)) {
    node = ref_cell_size_per(ref_cell) - 1;
    ref_cell_c2n(ref_cell, node, cell) = nodes[node];
  }

  return REF_SUCCESS;
}